

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::buildDualProblem
          (SPxLPBase<double> *this,SPxLPBase<double> *dualLP,SPxRowId *primalRowIds,
          SPxColId *primalColIds,SPxRowId *dualRowIds,SPxColId *dualColIds,int *nprimalrows,
          int *nprimalcols,int *ndualrows,int *ndualcols)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  int iVar5;
  pointer pdVar6;
  Item *pIVar7;
  Real RVar8;
  Type TVar9;
  DataKey DVar10;
  double *pdVar11;
  ulong *puVar12;
  double *pdVar13;
  SPxInternalCodeException *this_00;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int i;
  int iVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  uint uVar21;
  int numprimalrows;
  uint uStack_284;
  int numdualrows;
  int numprimalcols;
  uint uStack_274;
  DataArray<soplex::SPxColId> dualcolids;
  double local_248;
  DSVectorBase<double> col;
  int numdualcols;
  SPxColId *local_1d0;
  double local_1c8;
  LPColSetBase<double> dualcols;
  LPRowSetBase<double> dualrows;
  
  local_1d0 = dualColIds;
  if ((dualRowIds == (SPxRowId *)0x0 ||
      (primalColIds == (SPxColId *)0x0 || primalRowIds == (SPxRowId *)0x0)) ||
      dualColIds == (SPxColId *)0x0) {
    DataArray<soplex::SPxRowId>::DataArray
              ((DataArray<soplex::SPxRowId> *)&dualrows,
               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum * 2,0,1.2);
    DataArray<soplex::SPxColId>::DataArray
              ((DataArray<soplex::SPxColId> *)&dualcols,
               (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum * 2,0,1.2);
    DataArray<soplex::SPxRowId>::DataArray
              ((DataArray<soplex::SPxRowId> *)&col,
               (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum * 2,0,1.2);
    DataArray<soplex::SPxColId>::DataArray
              (&dualcolids,(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum * 2
               ,0,1.2);
    _numprimalrows = (double)((ulong)uStack_284 << 0x20);
    _numprimalcols = (double)((ulong)uStack_274 << 0x20);
    numdualrows = 0;
    numdualcols = 0;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x4b])
              (this,dualLP,
               dualrows.super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>._8_8_,
               dualcols.super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>._8_8_,
               col.super_SVectorBase<double>.m_elem,dualcolids.data,&numprimalrows,&numprimalcols,
               &numdualrows,&numdualcols);
    if (primalRowIds != (SPxRowId *)0x0) {
      *nprimalrows = numprimalrows;
    }
    if (primalColIds != (SPxColId *)0x0) {
      *nprimalcols = numprimalcols;
    }
    if (dualRowIds != (SPxRowId *)0x0) {
      *ndualrows = numdualrows;
    }
    if (local_1d0 != (SPxColId *)0x0) {
      *ndualcols = numdualcols;
    }
    DataArray<soplex::SPxColId>::~DataArray(&dualcolids);
    DataArray<soplex::SPxRowId>::~DataArray((DataArray<soplex::SPxRowId> *)&col);
    DataArray<soplex::SPxColId>::~DataArray((DataArray<soplex::SPxColId> *)&dualcols);
    DataArray<soplex::SPxRowId>::~DataArray((DataArray<soplex::SPxRowId> *)&dualrows);
  }
  else {
    (*(dualLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x45])
              (dualLP,(ulong)((uint)(this->thesense == MINIMIZE) * 2 - 1));
    LPRowSetBase<double>::LPRowSetBase
              (&dualrows,(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,-1);
    LPColSetBase<double>::LPColSetBase
              (&dualcols,(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,-1);
    DSVectorBase<double>::DSVectorBase(&col,1);
    psVar1 = &this->_tolerances;
    lVar16 = 0;
    lVar19 = 0;
    iVar17 = 0;
    while( true ) {
      iVar15 = (int)lVar19;
      if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= lVar19) break;
      DVar10 = (DataKey)cId(this,iVar15);
      *(DataKey *)((long)&(primalColIds->super_DataKey).info + lVar16) = DVar10;
      dVar2 = *(double *)
               ((long)(this->super_LPColSetBase<double>).low.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar16);
      pdVar11 = (double *)infinity();
      if ((-*pdVar11 < dVar2) ||
         (dVar2 = *(double *)
                   ((long)(this->super_LPColSetBase<double>).up.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar16), pdVar11 = (double *)infinity()
         , dVar2 < *pdVar11)) {
        dVar2 = *(double *)
                 ((long)(this->super_LPColSetBase<double>).low.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar16);
        pdVar11 = (double *)infinity();
        local_248 = *(double *)
                     ((long)(this->super_LPColSetBase<double>).up.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar16);
        if (dVar2 <= -*pdVar11) {
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&dualcolids,
                     &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
          RVar8 = Tolerances::epsilon((Tolerances *)dualcolids._0_8_);
          local_248 = ABS(local_248);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dualcolids.data);
          if (RVar8 < local_248) {
            dualcolids.thesize = 0;
            dualcolids.themax = 0x3ff00000;
            DSVectorBase<double>::add(&col,iVar15,(double *)&dualcolids);
            if (this->thesense == MINIMIZE) {
              pdVar6 = (this->super_LPColSetBase<double>).object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dualcolids._0_8_ = *(ulong *)((long)pdVar6 + lVar16) ^ 0x8000000000000000;
              _numprimalrows = -*(double *)((long)pdVar6 + lVar16);
              _numprimalcols = 0.0;
              numdualrows = 0;
              LPRowSetBase<double>::create
                        (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                         (double *)&numprimalcols,&numdualrows);
              pdVar6 = (this->super_LPColSetBase<double>).up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar12 = (ulong *)infinity();
              dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
              _numprimalrows = 0.0;
              _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
              LPColSetBase<double>::add
                        (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                         &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols);
            }
            else {
              _numprimalrows =
                   *(double *)
                    ((long)(this->super_LPColSetBase<double>).object.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar16);
              _numprimalcols = 0.0;
              numdualrows = 0;
              dualcolids._0_8_ = _numprimalrows;
              LPRowSetBase<double>::create
                        (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                         (double *)&numprimalcols,&numdualrows);
              pdVar6 = (this->super_LPColSetBase<double>).up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dualcolids.thesize = 0;
              dualcolids.themax = 0;
              pdVar11 = (double *)infinity();
              _numprimalrows = *pdVar11;
              _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
              LPColSetBase<double>::add
                        (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                         &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols);
            }
            goto LAB_00185b6e;
          }
          if (this->thesense == MINIMIZE) {
            dualcolids._0_8_ =
                 *(ulong *)((long)(this->super_LPColSetBase<double>).object.val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar16) ^ 0x8000000000000000;
            pdVar11 = (double *)infinity();
            _numprimalrows = *pdVar11;
            _numprimalcols = 0.0;
            numdualrows = 0;
            LPRowSetBase<double>::create
                      (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                       (double *)&numprimalcols,&numdualrows);
          }
          else {
            puVar12 = (ulong *)infinity();
            dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
            uVar4 = *(undefined8 *)
                     ((long)(this->super_LPColSetBase<double>).object.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar16);
            uVar21 = (uint)((ulong)uVar4 >> 0x20);
            if (this->thesense == MINIMIZE) {
              uVar21 = uVar21 ^ 0x80000000;
            }
            _numprimalcols = 0.0;
            _numprimalrows = (double)CONCAT44(uVar21,(int)uVar4);
            numdualrows = 0;
            LPRowSetBase<double>::create
                      (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                       (double *)&numprimalcols,&numdualrows);
          }
        }
        else {
          pdVar11 = (double *)infinity();
          dVar2 = *(double *)
                   ((long)(this->super_LPColSetBase<double>).low.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar16);
          if (*pdVar11 <= local_248) {
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&dualcolids,
                       &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
            RVar8 = Tolerances::epsilon((Tolerances *)dualcolids._0_8_);
            local_248 = ABS(dVar2);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dualcolids.data);
            if (RVar8 < local_248) {
              dualcolids.thesize = 0;
              dualcolids.themax = 0x3ff00000;
              DSVectorBase<double>::add(&col,iVar15,(double *)&dualcolids);
              if (this->thesense == MINIMIZE) {
                pdVar6 = (this->super_LPColSetBase<double>).object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                dualcolids._0_8_ = *(ulong *)((long)pdVar6 + lVar16) ^ 0x8000000000000000;
                _numprimalrows = -*(double *)((long)pdVar6 + lVar16);
                _numprimalcols = 0.0;
                numdualrows = 0;
                LPRowSetBase<double>::create
                          (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                           (double *)&numprimalcols,&numdualrows);
                pdVar6 = (this->super_LPColSetBase<double>).low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                dualcolids.thesize = 0;
                dualcolids.themax = 0;
                pdVar11 = (double *)infinity();
                _numprimalrows = *pdVar11;
                _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                LPColSetBase<double>::add
                          (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                           &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols);
              }
              else {
                _numprimalrows =
                     *(double *)
                      ((long)(this->super_LPColSetBase<double>).object.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar16);
                _numprimalcols = 0.0;
                numdualrows = 0;
                dualcolids._0_8_ = _numprimalrows;
                LPRowSetBase<double>::create
                          (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                           (double *)&numprimalcols,&numdualrows);
                pdVar6 = (this->super_LPColSetBase<double>).low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                puVar12 = (ulong *)infinity();
                dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
                _numprimalrows = 0.0;
                _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                LPColSetBase<double>::add
                          (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                           &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols);
              }
              goto LAB_00185b6e;
            }
            if (this->thesense == MINIMIZE) {
              puVar12 = (ulong *)infinity();
              dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
              uVar4 = *(undefined8 *)
                       ((long)(this->super_LPColSetBase<double>).object.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar16);
              uVar21 = (uint)((ulong)uVar4 >> 0x20);
              if (this->thesense == MINIMIZE) {
                uVar21 = uVar21 ^ 0x80000000;
              }
              _numprimalcols = 0.0;
              _numprimalrows = (double)CONCAT44(uVar21,(int)uVar4);
              numdualrows = 0;
              LPRowSetBase<double>::create
                        (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                         (double *)&numprimalcols,&numdualrows);
            }
            else {
              dualcolids._0_8_ =
                   *(undefined8 *)
                    ((long)(this->super_LPColSetBase<double>).object.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar16);
              pdVar11 = (double *)infinity();
              _numprimalrows = *pdVar11;
              _numprimalcols = 0.0;
              numdualrows = 0;
              LPRowSetBase<double>::create
                        (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                         (double *)&numprimalcols,&numdualrows);
            }
          }
          else {
            dVar3 = *(double *)
                     ((long)(this->super_LPColSetBase<double>).up.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar16);
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&dualcolids,
                       &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
            local_1c8 = Tolerances::epsilon((Tolerances *)dualcolids._0_8_);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dualcolids.data);
            if (local_1c8 < ABS(dVar2 - dVar3)) {
              local_248 = *(double *)
                           ((long)(this->super_LPColSetBase<double>).low.val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar16);
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&dualcolids
                         ,&psVar1->
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
              RVar8 = Tolerances::epsilon((Tolerances *)dualcolids._0_8_);
              local_248 = ABS(local_248);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dualcolids.data);
              if (local_248 <= RVar8) {
                dualcolids.thesize = 0;
                dualcolids.themax = 0x3ff00000;
                DSVectorBase<double>::add(&col,iVar15,(double *)&dualcolids);
                if (this->thesense == MINIMIZE) {
                  puVar12 = (ulong *)infinity();
                  dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
                  uVar4 = *(undefined8 *)
                           ((long)(this->super_LPColSetBase<double>).object.val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar16);
                  uVar21 = (uint)((ulong)uVar4 >> 0x20);
                  if (this->thesense == MINIMIZE) {
                    uVar21 = uVar21 ^ 0x80000000;
                  }
                  _numprimalcols = 0.0;
                  _numprimalrows = (double)CONCAT44(uVar21,(int)uVar4);
                  numdualrows = 0;
                  LPRowSetBase<double>::create
                            (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                             (double *)&numprimalcols,&numdualrows);
                  pdVar6 = (this->super_LPColSetBase<double>).up.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  puVar12 = (ulong *)infinity();
                  dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
                  _numprimalrows = 0.0;
                  _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                  LPColSetBase<double>::add
                            (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                             &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols)
                  ;
                }
                else {
                  dualcolids._0_8_ =
                       *(undefined8 *)
                        ((long)(this->super_LPColSetBase<double>).object.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar16);
                  pdVar11 = (double *)infinity();
                  _numprimalrows = *pdVar11;
                  _numprimalcols = 0.0;
                  numdualrows = 0;
                  LPRowSetBase<double>::create
                            (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                             (double *)&numprimalcols,&numdualrows);
                  pdVar6 = (this->super_LPColSetBase<double>).up.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  dualcolids.thesize = 0;
                  dualcolids.themax = 0;
                  pdVar11 = (double *)infinity();
                  _numprimalrows = *pdVar11;
                  _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                  LPColSetBase<double>::add
                            (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                             &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols)
                  ;
                }
              }
              else {
                local_248 = *(double *)
                             ((long)(this->super_LPColSetBase<double>).up.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16);
                std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                           &dualcolids,
                           &psVar1->
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
                RVar8 = Tolerances::epsilon((Tolerances *)dualcolids._0_8_);
                local_248 = ABS(local_248);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dualcolids.data);
                if (RVar8 < local_248) {
                  pdVar6 = (this->super_LPColSetBase<double>).object.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar4 = *(undefined8 *)((long)pdVar6 + lVar16);
                  uVar21 = (uint)((ulong)uVar4 >> 0x20);
                  bVar20 = this->thesense == MINIMIZE;
                  if (bVar20) {
                    uVar21 = uVar21 ^ 0x80000000;
                  }
                  dualcolids.themax = uVar21;
                  dualcolids.thesize = (int)uVar4;
                  uVar4 = *(undefined8 *)((long)pdVar6 + lVar16);
                  uVar21 = (uint)((ulong)uVar4 >> 0x20);
                  if (bVar20) {
                    uVar21 = uVar21 ^ 0x80000000;
                  }
                  _numprimalcols = 0.0;
                  _numprimalrows = (double)CONCAT44(uVar21,(int)uVar4);
                  numdualrows = 0;
                  LPRowSetBase<double>::create
                            (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                             (double *)&numprimalcols,&numdualrows);
                  dualcolids.thesize = 0;
                  dualcolids.themax = 0x3ff00000;
                  DSVectorBase<double>::add(&col,iVar15,(double *)&dualcolids);
                  pdVar11 = (double *)
                            ((long)(this->super_LPColSetBase<double>).low.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar16);
                  if (this->thesense == MINIMIZE) {
                    dualcolids.thesize = 0;
                    dualcolids.themax = 0;
                    pdVar13 = (double *)infinity();
                    _numprimalrows = *pdVar13;
                    _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                    LPColSetBase<double>::add
                              (&dualcols,pdVar11,(double *)&dualcolids,
                               &col.super_SVectorBase<double>,(double *)&numprimalrows,
                               &numprimalcols);
                    pdVar6 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    puVar12 = (ulong *)infinity();
                    dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
                    _numprimalrows = 0.0;
                    _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                    LPColSetBase<double>::add
                              (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                               &col.super_SVectorBase<double>,(double *)&numprimalrows,
                               &numprimalcols);
                  }
                  else {
                    puVar12 = (ulong *)infinity();
                    dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
                    _numprimalrows = 0.0;
                    _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                    LPColSetBase<double>::add
                              (&dualcols,pdVar11,(double *)&dualcolids,
                               &col.super_SVectorBase<double>,(double *)&numprimalrows,
                               &numprimalcols);
                    pdVar6 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    dualcolids.thesize = 0;
                    dualcolids.themax = 0;
                    pdVar11 = (double *)infinity();
                    _numprimalrows = *pdVar11;
                    _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                    LPColSetBase<double>::add
                              (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                               &col.super_SVectorBase<double>,(double *)&numprimalrows,
                               &numprimalcols);
                  }
                  col.super_SVectorBase<double>.memused = 0;
                  iVar17 = iVar17 + 2;
                  goto LAB_00185b81;
                }
                dualcolids.thesize = 0;
                dualcolids.themax = 0x3ff00000;
                DSVectorBase<double>::add(&col,iVar15,(double *)&dualcolids);
                if (this->thesense == MINIMIZE) {
                  dualcolids._0_8_ =
                       *(ulong *)((long)(this->super_LPColSetBase<double>).object.val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar16) ^
                       0x8000000000000000;
                  pdVar11 = (double *)infinity();
                  _numprimalrows = *pdVar11;
                  _numprimalcols = 0.0;
                  numdualrows = 0;
                  LPRowSetBase<double>::create
                            (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                             (double *)&numprimalcols,&numdualrows);
                  pdVar6 = (this->super_LPColSetBase<double>).low.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  dualcolids.thesize = 0;
                  dualcolids.themax = 0;
                  pdVar11 = (double *)infinity();
                  _numprimalrows = *pdVar11;
                  _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                  LPColSetBase<double>::add
                            (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                             &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols)
                  ;
                }
                else {
                  puVar12 = (ulong *)infinity();
                  dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
                  uVar4 = *(undefined8 *)
                           ((long)(this->super_LPColSetBase<double>).object.val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar16);
                  uVar21 = (uint)((ulong)uVar4 >> 0x20);
                  if (this->thesense == MINIMIZE) {
                    uVar21 = uVar21 ^ 0x80000000;
                  }
                  _numprimalcols = 0.0;
                  _numprimalrows = (double)CONCAT44(uVar21,(int)uVar4);
                  numdualrows = 0;
                  LPRowSetBase<double>::create
                            (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                             (double *)&numprimalcols,&numdualrows);
                  pdVar6 = (this->super_LPColSetBase<double>).low.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  puVar12 = (ulong *)infinity();
                  dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
                  _numprimalrows = 0.0;
                  _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
                  LPColSetBase<double>::add
                            (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                             &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols)
                  ;
                }
              }
LAB_00185b6e:
              col.super_SVectorBase<double>.memused = 0;
              iVar17 = iVar17 + 1;
            }
            else {
              pdVar6 = (this->super_LPColSetBase<double>).object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar4 = *(undefined8 *)((long)pdVar6 + lVar16);
              uVar21 = (uint)((ulong)uVar4 >> 0x20);
              bVar20 = this->thesense == MINIMIZE;
              if (bVar20) {
                uVar21 = uVar21 ^ 0x80000000;
              }
              dualcolids.themax = uVar21;
              dualcolids.thesize = (int)uVar4;
              uVar4 = *(undefined8 *)((long)pdVar6 + lVar16);
              uVar21 = (uint)((ulong)uVar4 >> 0x20);
              if (bVar20) {
                uVar21 = uVar21 ^ 0x80000000;
              }
              _numprimalcols = 0.0;
              _numprimalrows = (double)CONCAT44(uVar21,(int)uVar4);
              numdualrows = 0;
              LPRowSetBase<double>::create
                        (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                         (double *)&numprimalcols,&numdualrows);
              dualcolids.thesize = 0;
              dualcolids.themax = 0x3ff00000;
              DSVectorBase<double>::add(&col,iVar15,(double *)&dualcolids);
              pdVar6 = (this->super_LPColSetBase<double>).low.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dualcolids.thesize = 0;
              dualcolids.themax = 0;
              pdVar11 = (double *)infinity();
              _numprimalrows = *pdVar11;
              _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
              LPColSetBase<double>::add
                        (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                         &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols);
              pdVar6 = (this->super_LPColSetBase<double>).low.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar12 = (ulong *)infinity();
              dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
              _numprimalrows = 0.0;
              _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
              LPColSetBase<double>::add
                        (&dualcols,(double *)((long)pdVar6 + lVar16),(double *)&dualcolids,
                         &col.super_SVectorBase<double>,(double *)&numprimalrows,&numprimalcols);
              col.super_SVectorBase<double>.memused = 0;
              iVar17 = iVar17 + 2;
            }
          }
        }
      }
      else {
        pdVar6 = (this->super_LPColSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar4 = *(undefined8 *)((long)pdVar6 + lVar16);
        uVar21 = (uint)((ulong)uVar4 >> 0x20);
        bVar20 = this->thesense == MINIMIZE;
        if (bVar20) {
          uVar21 = uVar21 ^ 0x80000000;
        }
        dualcolids.themax = uVar21;
        dualcolids.thesize = (int)uVar4;
        uVar4 = *(undefined8 *)((long)pdVar6 + lVar16);
        uVar21 = (uint)((ulong)uVar4 >> 0x20);
        if (bVar20) {
          uVar21 = uVar21 ^ 0x80000000;
        }
        _numprimalcols = 0.0;
        _numprimalrows = (double)CONCAT44(uVar21,(int)uVar4);
        numdualrows = 0;
        LPRowSetBase<double>::create
                  (&dualrows,0,(double *)&dualcolids,(double *)&numprimalrows,
                   (double *)&numprimalcols,&numdualrows);
      }
LAB_00185b81:
      lVar16 = lVar16 + 8;
      lVar19 = lVar19 + 1;
    }
    (*(dualLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[8])(dualLP,&dualrows,0);
    for (lVar16 = 0; lVar19 != lVar16; lVar16 = lVar16 + 1) {
      DVar10 = (DataKey)rId(dualLP,(int)lVar16);
      dualRowIds[lVar16].super_DataKey = DVar10;
    }
    *nprimalcols = iVar15;
    *ndualrows = iVar15;
    lVar19 = 0;
    uVar21 = 0;
    for (lVar16 = 0; lVar16 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        lVar16 = lVar16 + 1) {
      iVar15 = (int)lVar16;
      TVar9 = LPRowSetBase<double>::type(&this->super_LPRowSetBase<double>,iVar15);
      if (RANGE < TVar9) {
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&dualcolids,"XLPFRD01 This should never happen.",
                   (allocator *)&numprimalrows);
        SPxInternalCodeException::SPxInternalCodeException(this_00,(string *)&dualcolids);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      switch(TVar9) {
      case LESS_EQUAL:
        DVar10 = (DataKey)rId(this,iVar15);
        primalRowIds[(int)uVar21].super_DataKey = DVar10;
        pdVar11 = (double *)
                  ((long)(this->super_LPRowSetBase<double>).right.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar19);
        if (this->thesense == MINIMIZE) {
          puVar12 = (ulong *)infinity();
          dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
          _numprimalrows = 0.0;
          _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
          LPColSetBase<double>::add
                    (&dualcols,pdVar11,(double *)&dualcolids,
                     (SVectorBase<double> *)
                     ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                     *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar19)),(double *)&numprimalrows,
                     &numprimalcols);
          uVar21 = uVar21 + 1;
        }
        else {
          dualcolids.thesize = 0;
          dualcolids.themax = 0;
          iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                   thekey)->idx + lVar19);
          pIVar7 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          pdVar13 = (double *)infinity();
          _numprimalrows = *pdVar13;
          _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
          LPColSetBase<double>::add
                    (&dualcols,pdVar11,(double *)&dualcolids,
                     (SVectorBase<double> *)(pIVar7 + iVar15),(double *)&numprimalrows,
                     &numprimalcols);
LAB_00186331:
          uVar21 = uVar21 + 1;
        }
        break;
      case EQUAL:
        DVar10 = (DataKey)rId(this,iVar15);
        primalRowIds[(int)uVar21].super_DataKey = DVar10;
        pdVar6 = (this->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        puVar12 = (ulong *)infinity();
        dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
        iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                 thekey)->idx + lVar19);
        pIVar7 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
        pdVar11 = (double *)infinity();
        _numprimalrows = *pdVar11;
        _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
        LPColSetBase<double>::add
                  (&dualcols,(double *)((long)pdVar6 + lVar19),(double *)&dualcolids,
                   (SVectorBase<double> *)(pIVar7 + iVar15),(double *)&numprimalrows,&numprimalcols)
        ;
        uVar21 = uVar21 + 1;
        break;
      case GREATER_EQUAL:
        DVar10 = (DataKey)rId(this,iVar15);
        primalRowIds[(int)uVar21].super_DataKey = DVar10;
        pdVar11 = (double *)
                  ((long)(this->super_LPRowSetBase<double>).left.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar19);
        if (this->thesense == MINIMIZE) {
          dualcolids.thesize = 0;
          dualcolids.themax = 0;
          iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                   thekey)->idx + lVar19);
          pIVar7 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          pdVar13 = (double *)infinity();
          _numprimalrows = *pdVar13;
          _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
          LPColSetBase<double>::add
                    (&dualcols,pdVar11,(double *)&dualcolids,
                     (SVectorBase<double> *)(pIVar7 + iVar15),(double *)&numprimalrows,
                     &numprimalcols);
          goto LAB_00186331;
        }
        puVar12 = (ulong *)infinity();
        dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
        _numprimalrows = 0.0;
        _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
        LPColSetBase<double>::add
                  (&dualcols,pdVar11,(double *)&dualcolids,
                   (SVectorBase<double> *)
                   ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                   *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                   thekey)->idx + lVar19)),(double *)&numprimalrows,&numprimalcols);
        uVar21 = uVar21 + 1;
        break;
      case RANGE:
        if (this->thesense == MINIMIZE) {
          DVar10 = (DataKey)rId(this,iVar15);
          primalRowIds[(int)uVar21].super_DataKey = DVar10;
          pdVar6 = (this->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dualcolids.thesize = 0;
          dualcolids.themax = 0;
          iVar5 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                  thekey)->idx + lVar19);
          pIVar7 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          pdVar11 = (double *)infinity();
          _numprimalrows = *pdVar11;
          _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
          LPColSetBase<double>::add
                    (&dualcols,(double *)((long)pdVar6 + lVar19),(double *)&dualcolids,
                     (SVectorBase<double> *)(pIVar7 + iVar5),(double *)&numprimalrows,&numprimalcols
                    );
          DVar10 = (DataKey)rId(this,iVar15);
          primalRowIds[(long)(int)uVar21 + 1].super_DataKey = DVar10;
          pdVar6 = (this->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar12 = (ulong *)infinity();
          dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
          _numprimalrows = 0.0;
          _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
          LPColSetBase<double>::add
                    (&dualcols,(double *)((long)pdVar6 + lVar19),(double *)&dualcolids,
                     (SVectorBase<double> *)
                     ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                     *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar19)),(double *)&numprimalrows,
                     &numprimalcols);
          uVar21 = uVar21 + 2;
        }
        else {
          DVar10 = (DataKey)rId(this,iVar15);
          primalRowIds[(int)uVar21].super_DataKey = DVar10;
          pdVar6 = (this->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar12 = (ulong *)infinity();
          dualcolids._0_8_ = *puVar12 ^ 0x8000000000000000;
          _numprimalrows = 0.0;
          _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
          LPColSetBase<double>::add
                    (&dualcols,(double *)((long)pdVar6 + lVar19),(double *)&dualcolids,
                     (SVectorBase<double> *)
                     ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                     *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar19)),(double *)&numprimalrows,
                     &numprimalcols);
          DVar10 = (DataKey)rId(this,iVar15);
          primalRowIds[(long)(int)uVar21 + 1].super_DataKey = DVar10;
          pdVar6 = (this->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dualcolids.thesize = 0;
          dualcolids.themax = 0;
          iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                   thekey)->idx + lVar19);
          pIVar7 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          pdVar11 = (double *)infinity();
          _numprimalrows = *pdVar11;
          _numprimalcols = (double)((ulong)_numprimalcols & 0xffffffff00000000);
          LPColSetBase<double>::add
                    (&dualcols,(double *)((long)pdVar6 + lVar19),(double *)&dualcolids,
                     (SVectorBase<double> *)(pIVar7 + iVar15),(double *)&numprimalrows,
                     &numprimalcols);
          uVar21 = uVar21 + 2;
        }
      }
      lVar19 = lVar19 + 8;
    }
    uVar14 = 0;
    (*(dualLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xd])(dualLP,&dualcols,0);
    uVar18 = 0;
    if (0 < (int)uVar21) {
      uVar18 = (ulong)uVar21;
    }
    for (; uVar18 != uVar14; uVar14 = uVar14 + 1) {
      DVar10 = (DataKey)cId(dualLP,iVar17 + (int)uVar14);
      local_1d0[uVar14].super_DataKey = DVar10;
    }
    *nprimalrows = uVar21;
    *ndualcols = uVar21;
    DSVectorBase<double>::~DSVectorBase(&col);
    LPColSetBase<double>::~LPColSetBase(&dualcols);
    LPRowSetBase<double>::~LPRowSetBase(&dualrows);
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::buildDualProblem(SPxLPBase<R>& dualLP, SPxRowId primalRowIds[],
                                    SPxColId primalColIds[],
                                    SPxRowId dualRowIds[], SPxColId dualColIds[], int* nprimalrows, int* nprimalcols, int* ndualrows,
                                    int* ndualcols)
{
   // Setting up the primalrowids and dualcolids arrays if not given as parameters
   if(primalRowIds == nullptr || primalColIds == nullptr || dualRowIds == nullptr
         || dualColIds == nullptr)
   {
      DataArray < SPxRowId > primalrowids(2 * nRows());
      DataArray < SPxColId > primalcolids(2 * nCols());
      DataArray < SPxRowId > dualrowids(2 * nCols());
      DataArray < SPxColId > dualcolids(2 * nRows());
      int numprimalrows = 0;
      int numprimalcols = 0;
      int numdualrows = 0;
      int numdualcols = 0;

      buildDualProblem(dualLP, primalrowids.get_ptr(), primalcolids.get_ptr(), dualrowids.get_ptr(),
                       dualcolids.get_ptr(), &numprimalrows, &numprimalcols, &numdualrows, &numdualcols);

      if(primalRowIds != nullptr)
      {
         primalRowIds = primalrowids.get_ptr();
         (*nprimalrows) = numprimalrows;
      }

      if(primalColIds != nullptr)
      {
         primalColIds = primalcolids.get_ptr();
         (*nprimalcols) = numprimalcols;
      }

      if(dualRowIds != nullptr)
      {
         dualRowIds = dualrowids.get_ptr();
         (*ndualrows) = numdualrows;
      }

      if(dualColIds != nullptr)
      {
         dualColIds = dualcolids.get_ptr();
         (*ndualcols) = numdualcols;
      }

      return;
   }

   // setting the sense of the dual LP
   if(spxSense() == MINIMIZE)
      dualLP.changeSense(MAXIMIZE);
   else
      dualLP.changeSense(MINIMIZE);

   LPRowSetBase<R> dualrows(nCols());
   LPColSetBase<R> dualcols(nRows());
   DSVectorBase<R> col(1);

   int numAddedRows = 0;
   int numVarBoundCols = 0;
   int primalrowsidx = 0;
   int primalcolsidx = 0;

   for(int i = 0; i < nCols(); ++i)
   {
      primalColIds[primalcolsidx] = cId(i);
      primalcolsidx++;

      if(lower(i) <= R(-infinity) && upper(i) >= R(infinity))   // unrestricted variables
      {
         dualrows.create(0, obj(i), obj(i));
         numAddedRows++;
      }
      else if(lower(i) <= R(-infinity))   // no lower bound is set, indicating a <= 0 variable
      {
         if(isZero(upper(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, obj(i), R(infinity));
            else
               dualrows.create(0, R(-infinity), obj(i));
         }
         else // additional upper bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(upper(i) >= R(infinity))   // no upper bound set, indicating a >= 0 variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, R(-infinity), obj(i));
            else
               dualrows.create(0, obj(i), R(infinity));
         }
         else // additional lower bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(NE(lower(i), upper(i), this->tolerances()->epsilon()))   // a boxed variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // variable bounded between 0 and upper(i)
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }
         else if(isZero(upper(i),
                        this->tolerances()->epsilon()))   // variable bounded between lower(i) and 0
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }
         else // variable bounded between lower(i) and upper(i)
         {
            dualrows.create(0, obj(i), obj(i));

            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualcols.add(lower(i), 0.0, col, R(infinity));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualcols.add(lower(i), R(-infinity), col, 0.0);
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols += 2;
         }

         numAddedRows++;
      }
      else
      {
         assert(lower(i) == upper(i));

         dualrows.create(0, obj(i), obj(i));

         col.add(numAddedRows, 1.0);
         dualcols.add(lower(i), 0, col, R(infinity));
         dualcols.add(lower(i), R(-infinity), col, 0);
         col.clear();

         numVarBoundCols += 2;
         numAddedRows++;
      }
   }

   // adding the empty rows to the dual LP
   dualLP.addRows(dualrows);

   // setting the dual row ids for the related primal cols.
   // this assumes that the rows are added in sequential order.
   for(int i = 0; i < primalcolsidx; i++)
      dualRowIds[i] = dualLP.rId(i);

   (*nprimalcols) = primalcolsidx;
   (*ndualrows) = primalcolsidx;

   // iterating over each of the rows to create dual columns
   for(int i = 0; i < nRows(); ++i)
   {
      // checking the type of the row
      switch(rowType(i))
      {
      case LPRowBase<R>::RANGE: // range constraint, requires the addition of two dual variables
         assert(lhs(i) > R(-infinity));
         assert(rhs(i) < R(infinity));

         if(spxSense() == MINIMIZE)
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         }
         else
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));
         }

         break;

      case LPRowBase<R>::GREATER_EQUAL: // >= constraint
         assert(lhs(i) > R(-infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));
         else
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

         break;

      case LPRowBase<R>::LESS_EQUAL: // <= constriant
         assert(rhs(i) < R(infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         else
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));

         break;

      case LPRowBase<R>::EQUAL: // Equality constraint
         assert(EQ(lhs(i), rhs(i), this->tolerances()->epsilon()));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;
         dualcols.add(rhs(i), R(-infinity), rowVector(i), R(infinity));
         break;

      default:
         throw SPxInternalCodeException("XLPFRD01 This should never happen.");
      }
   }

   // adding the filled columns to the dual LP
   dualLP.addCols(dualcols);

   // setting the dual column ids for the related primal rows.
   // this assumes that the columns are added in sequential order.
   for(int i = 0; i < primalrowsidx; i++)
      dualColIds[i] = dualLP.cId(i + numVarBoundCols);

   (*nprimalrows) = primalrowsidx;
   (*ndualcols) = primalrowsidx;
}